

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

ssh2_userkey * ppk_load_f(Filename *filename,char *passphrase,char **errorstr)

{
  LoadedFile *lf_00;
  ssh2_userkey *local_30;
  ssh2_userkey *toret;
  LoadedFile *lf;
  char **errorstr_local;
  char *passphrase_local;
  Filename *filename_local;
  
  lf_00 = lf_load_keyfile(filename,errorstr);
  if (lf_00 == (LoadedFile *)0x0) {
    local_30 = (ssh2_userkey *)0x0;
    *errorstr = "can\'t open file";
  }
  else {
    local_30 = ppk_load_s(lf_00->binarysource_,passphrase,errorstr);
    lf_free(lf_00);
  }
  return local_30;
}

Assistant:

ssh2_userkey *ppk_load_f(const Filename *filename, const char *passphrase,
                         const char **errorstr)
{
    LoadedFile *lf = lf_load_keyfile(filename, errorstr);
    ssh2_userkey *toret;
    if (lf) {
        toret = ppk_load_s(BinarySource_UPCAST(lf), passphrase, errorstr);
        lf_free(lf);
    } else {
        toret = NULL;
        *errorstr = "can't open file";
    }
    return toret;
}